

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void template_conformwords
               (t_template *tfrom,t_template *tto,int *conformaction,t_word *wfrom,t_word *wto)

{
  int iVar1;
  t_word tVar2;
  t_word wwas;
  int i;
  int nto;
  int nfrom;
  t_word *wto_local;
  t_word *wfrom_local;
  int *conformaction_local;
  t_template *tto_local;
  t_template *tfrom_local;
  
  iVar1 = tto->t_n;
  for (wwas._4_4_ = 0; (int)wwas._4_4_ < iVar1; wwas._4_4_ = wwas._4_4_ + 1) {
    if (-1 < conformaction[(int)wwas._4_4_]) {
      tVar2 = wto[(int)wwas._4_4_];
      wto[(int)wwas._4_4_] = wfrom[conformaction[(int)wwas._4_4_]];
      wfrom[conformaction[(int)wwas._4_4_]] = tVar2;
    }
  }
  return;
}

Assistant:

static void template_conformwords(t_template *tfrom, t_template *tto,
    int *conformaction, t_word *wfrom, t_word *wto)
{
    int nfrom = tfrom->t_n, nto = tto->t_n, i;
    for (i = 0; i < nto; i++)
    {
        if (conformaction[i] >= 0)
        {
                /* we swap the two, in case it's an array or list, so that
                when "wfrom" is deleted the old one gets cleaned up. */
            t_word wwas = wto[i];
            wto[i] = wfrom[conformaction[i]];
            wfrom[conformaction[i]] = wwas;
        }
    }
}